

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O0

void __thiscall nuraft::buffer_serializer::put_u8(buffer_serializer *this,uint8_t val)

{
  bool bVar1;
  overflow_error *this_00;
  byte *pbVar2;
  byte in_SIL;
  buffer_serializer *in_RDI;
  uint8_t *ptr;
  buffer_serializer *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = is_valid(in_stack_ffffffffffffffd8,(size_t)in_RDI);
  if (!bVar1) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"not enough space");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar2 = nuraft::buffer::data_begin(in_RDI->buf_);
  pbVar2[in_RDI->pos_] = in_SIL;
  pos(in_RDI);
  pos((buffer_serializer *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void buffer_serializer::put_u8(uint8_t val) {
    chk_length(val);
    uint8_t* ptr = buf_.data_begin() + pos_;
    ptr[0] = val;
    pos( pos() + sizeof(val) );
}